

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::RepeatedEnumFieldGenerator::GenerateRepeatedDataSizeCode
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  RepeatedEnumFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "int dataSize = 0;\nfor (int i = 0; i < this.$name$.length; i++) {\n  int element = this.$name$[i];\n  dataSize += com.google.protobuf.nano.CodedOutputByteBufferNano\n      .computeInt32SizeNoTag(element);\n}\n"
                    );
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateRepeatedDataSizeCode(io::Printer* printer) const {
  // Creates a variable dataSize and puts the serialized size in there.
  printer->Print(variables_,
    "int dataSize = 0;\n"
    "for (int i = 0; i < this.$name$.length; i++) {\n"
    "  int element = this.$name$[i];\n"
    "  dataSize += com.google.protobuf.nano.CodedOutputByteBufferNano\n"
    "      .computeInt32SizeNoTag(element);\n"
    "}\n");
}